

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pololu.h
# Opt level: O1

int SetPWMJrkPololu(POLOLU *pPololu,int pw)

{
  int iVar1;
  int iVar2;
  int iVar3;
  byte *pbVar4;
  ssize_t sVar5;
  uint uVar6;
  uint uVar7;
  ulong uVar8;
  byte local_238 [520];
  
  iVar1 = (int)((double)(pw + -0x5dc) * pPololu->CoefPWs[0]);
  if (pPololu->bProportionalPWs[0] == 0) {
    iVar2 = iVar1 + 0x5dc;
  }
  else {
    iVar2 = pPololu->MidPWs[0];
    if (iVar1 < 0) {
      iVar1 = (int)((ulong)((long)((pPololu->MinPWs[0] - iVar2) * iVar1) * -0x10624dd3) >> 0x20);
    }
    else {
      iVar1 = (int)((ulong)((long)((pPololu->MaxPWs[0] - iVar2) * iVar1) * 0x10624dd3) >> 0x20);
    }
    iVar2 = ((iVar1 >> 5) - (iVar1 >> 0x1f)) + iVar2;
  }
  iVar1 = pPololu->MaxPWs[0];
  if (iVar2 < pPololu->MaxPWs[0]) {
    iVar1 = iVar2;
  }
  if (iVar1 <= pPololu->MinPWs[0]) {
    iVar1 = pPololu->MinPWs[0];
  }
  iVar3 = iVar1 - pPololu->LastPWs[0];
  iVar2 = -iVar3;
  if (0 < iVar3) {
    iVar2 = iVar3;
  }
  if (pPololu->ThresholdPWs[0] <= iVar2) {
    iVar2 = pPololu->bEnableSetMultipleTargets;
    memset(local_238,0,0x200);
    if (iVar2 == 0) {
      pbVar4 = local_238 + 1;
      uVar7 = (iVar1 * 0xfff + -0x3e7c18) / 1000;
      local_238[0] = (byte)uVar7 & 0x1f | 0xc0;
      uVar6 = 2;
    }
    else {
      pbVar4 = local_238 + 3;
      local_238[0] = 0xaa;
      local_238[1] = (byte)pPololu->DeviceNumber;
      uVar7 = (iVar1 * 0xfff + -0x3e7c18) / 1000;
      local_238[2] = (byte)uVar7 & 0x1f | 0x40;
      uVar6 = 4;
    }
    *pbVar4 = (byte)(uVar7 >> 5) & 0x7f;
    iVar2 = (pPololu->RS232Port).DevType;
    if (iVar2 - 1U < 4) {
      iVar2 = (pPololu->RS232Port).s;
      uVar8 = 0;
      do {
        sVar5 = send(iVar2,local_238 + uVar8,(long)(int)(uVar6 - (int)uVar8),0);
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar7 = (int)uVar8 + (int)sVar5;
        uVar8 = (ulong)uVar7;
      } while ((int)uVar7 < (int)uVar6);
    }
    else {
      if (iVar2 != 0) {
        return 1;
      }
      iVar2 = *(int *)&(pPololu->RS232Port).hDev;
      uVar8 = 0;
      do {
        sVar5 = write(iVar2,local_238 + uVar8,(ulong)(uVar6 - (int)uVar8));
        if ((int)sVar5 < 1) {
          return 1;
        }
        uVar7 = (int)uVar8 + (int)sVar5;
        uVar8 = (ulong)uVar7;
      } while (uVar7 < uVar6);
    }
    if ((pPololu->bSaveRawData != 0) && ((FILE *)pPololu->pfSaveFile != (FILE *)0x0)) {
      fwrite(local_238,(ulong)uVar6,1,(FILE *)pPololu->pfSaveFile);
      fflush((FILE *)pPololu->pfSaveFile);
    }
    pPololu->LastPWs[0] = iVar1;
  }
  return 0;
}

Assistant:

inline int SetPWMJrkPololu(POLOLU* pPololu, int pw)
{
	unsigned char sendbuf[MAX_NB_BYTES_POLOLU];
	int target = 0;
	int sendbuflen = 0;
	int channel = 0; // Only 1 motor on Jrk...

	if (pPololu->bProportionalPWs[channel])
	{
		pw = (int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
		if (pw >= 0)
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MaxPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
		else
			pw = pPololu->MidPWs[channel]+pw*(pPololu->MinPWs[channel]-pPololu->MidPWs[channel])
			/(DEFAULT_MIN_PW_POLOLU-DEFAULT_MID_PW_POLOLU);
	}
	else
	{
		pw = DEFAULT_MID_PW_POLOLU+(int)(pPololu->CoefPWs[channel]*(pw-DEFAULT_MID_PW_POLOLU));
	}

	pw = max(min(pw, pPololu->MaxPWs[channel]), pPololu->MinPWs[channel]);
	//pw = max(min(pw, DEFAULT_ABSOLUTE_MAX_PW_POLOLU), DEFAULT_ABSOLUTE_MIN_PW_POLOLU);

	// The requested PWM is only applied if it is slightly different from the current value.
	if (abs(pw-pPololu->LastPWs[channel]) < pPololu->ThresholdPWs[channel]) return EXIT_SUCCESS;

	// bEnableSetMultipleTargets is used here to choose between Pololu protocol and compact protocol modes...
	if (pPololu->bEnableSetMultipleTargets)
	{
		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		sendbuf[0] = (unsigned char)BAUD_RATE_INDICATION_BYTE_POLOLU;
		sendbuf[1] = (unsigned char)pPololu->DeviceNumber;
		target = (pw-DEFAULT_MIN_PW_POLOLU)*4095/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU);
		sendbuf[2] = (unsigned char)(0x40 + (target & 0x1F)); // Command byte holds the lower 5 bits of target.
		sendbuf[3] = (unsigned char)((target >> 5) & 0x7F); // Data byte holds the upper 7 bits of target.
		sendbuflen = 4;
	}
	else
	{
		// Prepare data to send to device.
		memset(sendbuf, 0, sizeof(sendbuf));
		target = (pw-DEFAULT_MIN_PW_POLOLU)*4095/(DEFAULT_MAX_PW_POLOLU-DEFAULT_MIN_PW_POLOLU);
		sendbuf[0] = (unsigned char)(0xC0 + (target & 0x1F)); // Command byte holds the lower 5 bits of target.
		sendbuf[1] = (unsigned char)((target >> 5) & 0x7F); // Data byte holds the upper 7 bits of target.
		sendbuflen = 2;
	}

	if (WriteAllRS232Port(&pPololu->RS232Port, (unsigned char*)sendbuf, sendbuflen) != EXIT_SUCCESS)
	{
		return EXIT_FAILURE;
	}
	if ((pPololu->bSaveRawData)&&(pPololu->pfSaveFile))
	{
		fwrite(sendbuf, sendbuflen, 1, pPololu->pfSaveFile);
		fflush(pPololu->pfSaveFile);
	}

	// Update last known value.
	pPololu->LastPWs[channel] = pw;

	return EXIT_SUCCESS;
}